

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::PriceFieldTest_TestNothing_Test::TestBody
          (PriceFieldTest_TestNothing_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  PriceField field;
  AssertHelper local_58;
  Message local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  PriceField local_38 [16];
  long *local_28;
  long local_18 [2];
  
  bidfx_public_api::price::PriceField::PriceField(local_38);
  local_58.data_._0_4_ = 4;
  local_40.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((internal *)&local_50,"PriceField::NOTHING","field.GetType()",(Type *)&local_58,
             (Type *)&local_40);
  if (local_50.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x3b,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bidfx_public_api::price::PriceField::GetInt();
  }
  testing::Message::Message(&local_50);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
             ,0x3c,
             "Expected: field.GetInt() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_58,&local_50);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bidfx_public_api::price::PriceField::GetLong();
  }
  testing::Message::Message(&local_50);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
             ,0x3d,
             "Expected: field.GetLong() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_58,&local_50);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bidfx_public_api::price::PriceField::GetDouble();
  }
  testing::Message::Message(&local_50);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
             ,0x3e,
             "Expected: field.GetDouble() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_58,&local_50);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
    if (local_28 != local_18) {
      operator_delete(local_28,local_18[0] + 1);
    }
  }
  testing::Message::Message(&local_50);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
             ,0x3f,
             "Expected: field.GetString() throws an exception of type std::logic_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_58,&local_50);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
    }
  }
  bidfx_public_api::price::PriceField::~PriceField(local_38);
  return;
}

Assistant:

TEST(PriceFieldTest, TestNothing)
{
    PriceField field = PriceField();
    EXPECT_EQ(PriceField::NOTHING, field.GetType());
    EXPECT_THROW(field.GetInt(), std::logic_error);
    EXPECT_THROW(field.GetLong(), std::logic_error);
    EXPECT_THROW(field.GetDouble(), std::logic_error);
    EXPECT_THROW(field.GetString(), std::logic_error);
}